

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quantile_sort_tree.hpp
# Opt level: O1

interval_t __thiscall
duckdb::Interpolator<false>::
Operation<duckdb::timestamp_t,duckdb::interval_t,duckdb::MadAccessor<duckdb::timestamp_t,duckdb::interval_t,duckdb::timestamp_t>>
          (Interpolator<false> *this,timestamp_t *v_t,Vector *result,
          MadAccessor<duckdb::timestamp_t,_duckdb::interval_t,_duckdb::timestamp_t> *accessor)

{
  idx_t iVar1;
  idx_t iVar2;
  idx_t iVar3;
  long lVar4;
  _Iter_comp_iter<duckdb::QuantileCompare<duckdb::MadAccessor<duckdb::timestamp_t,_duckdb::interval_t,_duckdb::timestamp_t>_>_>
  __comp;
  _Iter_comp_iter<duckdb::QuantileCompare<duckdb::MadAccessor<duckdb::timestamp_t,_duckdb::interval_t,_duckdb::timestamp_t>_>_>
  __comp_00;
  _Iter_comp_iter<duckdb::QuantileCompare<duckdb::MadAccessor<duckdb::timestamp_t,_duckdb::interval_t,_duckdb::timestamp_t>_>_>
  __comp_01;
  bool bVar5;
  ulong uVar6;
  InvalidInputException *pIVar7;
  int64_t iVar8;
  RESULT_TYPE RVar9;
  interval_t iVar10;
  interval_t input;
  interval_t input_00;
  interval_t input_01;
  interval_t result_1;
  string local_78;
  pointer local_58;
  size_type sStack_50;
  pointer local_48;
  size_type sStack_40;
  
  bVar5 = this->desc;
  iVar1 = this->FRN;
  iVar2 = this->begin;
  iVar3 = this->end;
  local_78._M_dataplus._M_p = (pointer)accessor;
  local_78._M_string_length = (size_type)accessor;
  local_78.field_2._M_local_buf[0] = bVar5;
  if (this->CRN == iVar1) {
    if (iVar1 != iVar3 && iVar2 != iVar3) {
      uVar6 = (long)(iVar3 * 8 + iVar2 * -8) >> 3;
      lVar4 = 0x3f;
      if (uVar6 != 0) {
        for (; uVar6 >> lVar4 == 0; lVar4 = lVar4 + -1) {
        }
      }
      __comp._M_comp._17_7_ = local_78.field_2._M_allocated_capacity._1_7_;
      __comp._M_comp.desc = bVar5;
      __comp._M_comp.accessor_r = accessor;
      __comp._M_comp.accessor_l = accessor;
      ::std::
      __introselect<duckdb::timestamp_t*,long,__gnu_cxx::__ops::_Iter_comp_iter<duckdb::QuantileCompare<duckdb::MadAccessor<duckdb::timestamp_t,duckdb::interval_t,duckdb::timestamp_t>>>>
                (v_t + iVar2,v_t + iVar1,v_t + iVar3,(ulong)(((uint)lVar4 ^ 0x3f) * 2) ^ 0x7e,__comp
                );
    }
    RVar9 = MadAccessor<duckdb::timestamp_t,_duckdb::interval_t,_duckdb::timestamp_t>::operator()
                      (accessor,v_t + this->FRN);
    input._0_8_ = RVar9.micros;
    iVar8 = 0;
    bVar5 = TryCast::Operation<duckdb::interval_t,duckdb::interval_t>
                      (RVar9,(interval_t *)&local_58,false);
    if (!bVar5) {
      pIVar7 = (InvalidInputException *)__cxa_allocate_exception(0x10);
      input.micros = iVar8;
      CastExceptionText<duckdb::interval_t,duckdb::interval_t>(&local_78,RVar9._0_8_,input);
      InvalidInputException::InvalidInputException(pIVar7,(string *)&local_78);
      __cxa_throw(pIVar7,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
    }
    iVar10.micros = sStack_50;
    iVar10._0_8_ = local_58;
  }
  else {
    if (iVar1 != iVar3 && iVar2 != iVar3) {
      uVar6 = (long)(iVar3 * 8 + iVar2 * -8) >> 3;
      lVar4 = 0x3f;
      if (uVar6 != 0) {
        for (; uVar6 >> lVar4 == 0; lVar4 = lVar4 + -1) {
        }
      }
      __comp_00._M_comp._17_7_ = local_78.field_2._M_allocated_capacity._1_7_;
      __comp_00._M_comp.desc = bVar5;
      __comp_00._M_comp.accessor_r = accessor;
      __comp_00._M_comp.accessor_l = accessor;
      ::std::
      __introselect<duckdb::timestamp_t*,long,__gnu_cxx::__ops::_Iter_comp_iter<duckdb::QuantileCompare<duckdb::MadAccessor<duckdb::timestamp_t,duckdb::interval_t,duckdb::timestamp_t>>>>
                (v_t + iVar2,v_t + iVar1,v_t + iVar3,(ulong)(((uint)lVar4 ^ 0x3f) * 2) ^ 0x7e,
                 __comp_00);
    }
    iVar1 = this->FRN;
    iVar2 = this->end;
    local_78._M_dataplus._M_p = (pointer)accessor;
    local_78._M_string_length = (size_type)accessor;
    local_78.field_2._M_local_buf[0] = bVar5;
    if (this->CRN != iVar2 && iVar1 != iVar2) {
      uVar6 = (long)(iVar2 * 8 + iVar1 * -8) >> 3;
      lVar4 = 0x3f;
      if (uVar6 != 0) {
        for (; uVar6 >> lVar4 == 0; lVar4 = lVar4 + -1) {
        }
      }
      __comp_01._M_comp._17_7_ = local_78.field_2._M_allocated_capacity._1_7_;
      __comp_01._M_comp.desc = bVar5;
      __comp_01._M_comp.accessor_r = accessor;
      __comp_01._M_comp.accessor_l = accessor;
      ::std::
      __introselect<duckdb::timestamp_t*,long,__gnu_cxx::__ops::_Iter_comp_iter<duckdb::QuantileCompare<duckdb::MadAccessor<duckdb::timestamp_t,duckdb::interval_t,duckdb::timestamp_t>>>>
                (v_t + iVar1,v_t + this->CRN,v_t + iVar2,(ulong)(((uint)lVar4 ^ 0x3f) * 2) ^ 0x7e,
                 __comp_01);
    }
    RVar9 = MadAccessor<duckdb::timestamp_t,_duckdb::interval_t,_duckdb::timestamp_t>::operator()
                      (accessor,v_t + this->FRN);
    input_00._0_8_ = RVar9.micros;
    iVar8 = 0;
    bVar5 = TryCast::Operation<duckdb::interval_t,duckdb::interval_t>
                      (RVar9,(interval_t *)&local_58,false);
    if (!bVar5) {
      pIVar7 = (InvalidInputException *)__cxa_allocate_exception(0x10);
      input_00.micros = iVar8;
      CastExceptionText<duckdb::interval_t,duckdb::interval_t>(&local_78,RVar9._0_8_,input_00);
      InvalidInputException::InvalidInputException(pIVar7,(string *)&local_78);
      __cxa_throw(pIVar7,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
    }
    local_48 = local_58;
    sStack_40 = sStack_50;
    RVar9 = MadAccessor<duckdb::timestamp_t,_duckdb::interval_t,_duckdb::timestamp_t>::operator()
                      (accessor,v_t + this->CRN);
    input_01._0_8_ = RVar9.micros;
    iVar8 = 0;
    bVar5 = TryCast::Operation<duckdb::interval_t,duckdb::interval_t>
                      (RVar9,(interval_t *)&local_58,false);
    if (!bVar5) {
      pIVar7 = (InvalidInputException *)__cxa_allocate_exception(0x10);
      input_01.micros = iVar8;
      CastExceptionText<duckdb::interval_t,duckdb::interval_t>(&local_78,RVar9._0_8_,input_01);
      InvalidInputException::InvalidInputException(pIVar7,(string *)&local_78);
      __cxa_throw(pIVar7,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
    }
    local_78._M_dataplus._M_p = local_58;
    local_78._M_string_length = sStack_50;
    iVar10 = CastInterpolation::Interpolate<duckdb::interval_t>
                       ((interval_t *)&local_48,
                        this->RN -
                        (((double)CONCAT44(0x45300000,(int)(this->FRN >> 0x20)) -
                         1.9342813113834067e+25) +
                        ((double)CONCAT44(0x43300000,(int)this->FRN) - 4503599627370496.0)),
                        (interval_t *)&local_78);
  }
  return iVar10;
}

Assistant:

TARGET_TYPE Operation(INPUT_TYPE *v_t, Vector &result, const ACCESSOR &accessor = ACCESSOR()) const {
		using ACCESS_TYPE = typename ACCESSOR::RESULT_TYPE;
		QuantileCompare<ACCESSOR> comp(accessor, desc);
		if (CRN == FRN) {
			std::nth_element(v_t + begin, v_t + FRN, v_t + end, comp);
			return CastInterpolation::Cast<ACCESS_TYPE, TARGET_TYPE>(accessor(v_t[FRN]), result);
		} else {
			std::nth_element(v_t + begin, v_t + FRN, v_t + end, comp);
			std::nth_element(v_t + FRN, v_t + CRN, v_t + end, comp);
			auto lo = CastInterpolation::Cast<ACCESS_TYPE, TARGET_TYPE>(accessor(v_t[FRN]), result);
			auto hi = CastInterpolation::Cast<ACCESS_TYPE, TARGET_TYPE>(accessor(v_t[CRN]), result);
			return CastInterpolation::Interpolate<TARGET_TYPE>(lo, RN - FRN, hi);
		}
	}